

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O2

int av1_get_intra_inter_context(MACROBLOCKD *xd)

{
  _Bool _Var1;
  MB_MODE_INFO *pMVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  MB_MODE_INFO *pMVar7;
  
  pMVar2 = xd->above_mbmi;
  pMVar7 = xd->left_mbmi;
  _Var1 = xd->up_available;
  if ((_Var1 & xd->left_available) == 1) {
    if ((pMVar2->field_0xa7 & 0x80) == 0) {
      bVar3 = pMVar2->ref_frame[0] < '\x01';
    }
    else {
      bVar3 = false;
    }
    if ((pMVar7->field_0xa7 & 0x80) == 0) {
      bVar6 = pMVar7->ref_frame[0] < '\x01';
    }
    else {
      bVar6 = false;
    }
    uVar5 = 3;
    if (bVar3 == false) {
      uVar5 = (uint)(byte)(bVar6 | bVar3);
    }
    if (bVar6 == false) {
      uVar5 = (uint)(byte)(bVar6 | bVar3);
    }
    return uVar5;
  }
  iVar4 = 0;
  if (((xd->left_available | _Var1) & 1U) != 0) {
    if (_Var1 != false) {
      pMVar7 = pMVar2;
    }
    iVar4 = 0;
    if ((pMVar7->field_0xa7 & 0x80) == 0) {
      iVar4 = (uint)(pMVar7->ref_frame[0] < '\x01') * 2;
    }
  }
  return iVar4;
}

Assistant:

int av1_get_intra_inter_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  if (has_above && has_left) {  // both edges available
    const int above_intra = !is_inter_block(above_mbmi);
    const int left_intra = !is_inter_block(left_mbmi);
    return left_intra && above_intra ? 3 : left_intra || above_intra;
  } else if (has_above || has_left) {  // one edge available
    return 2 * !is_inter_block(has_above ? above_mbmi : left_mbmi);
  } else {
    return 0;
  }
}